

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall
soul::StructuralParser::parseInputOrOutputName(StructuralParser *this,EndpointDeclaration *e)

{
  bool bVar1;
  Identifier IVar2;
  Expression *pEVar3;
  EndpointDetails *pEVar4;
  Context local_30;
  
  getContext(&local_30,this);
  AST::Context::operator=(&(e->super_ASTObject).context,&local_30);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_30);
  IVar2 = parseIdentifierWithMaxLength(this,0x80);
  (e->name).name = IVar2.name;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2cada8);
  if (bVar1) {
    pEVar3 = parseExpression(this,false);
    pEVar4 = pool_ptr<soul::AST::EndpointDetails>::operator*(&e->details);
    (pEVar4->arraySize).object = pEVar3;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a0190);
  }
  parseAnnotation(this,&e->annotation);
  return;
}

Assistant:

void parseInputOrOutputName (AST::EndpointDeclaration& e)
    {
        e.context = getContext();
        e.name = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matchIf (Operator::openBracket))
        {
            e.getDetails().arraySize = parseExpression();
            expect (Operator::closeBracket);
        }

        parseAnnotation (e.annotation);
    }